

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O1

deUint64 __thiscall
deqp::gles2::Performance::anon_unknown_0::DrawCallBatchingTest::renderUnbatched
          (DrawCallBatchingTest *this)

{
  code *pcVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  long *plVar7;
  long *plVar8;
  pointer puVar9;
  long lVar10;
  code *pcVar11;
  long lVar12;
  long lVar13;
  GLint location;
  vector<int,_std::allocator<int>_> dynamicAttributeLocations;
  ostringstream s;
  long *local_230;
  long local_220;
  undefined4 uStack_218;
  undefined4 uStack_214;
  deUint32 local_20c;
  code *local_208;
  int local_1fc;
  long *local_1f8 [2];
  long local_1e8 [2];
  void *local_1d8;
  iterator iStack_1d0;
  int *local_1c8;
  deUint64 local_1b8;
  deUint64 local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  long lVar6;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  local_1d8 = (void *)0x0;
  iStack_1d0._M_current = (int *)0x0;
  local_1c8 = (int *)0x0;
  (**(code **)(lVar6 + 0x1a00))(0,0,0x20,0x20);
  (**(code **)(lVar6 + 0x1680))((this->m_program->m_program).m_program);
  if (0 < (this->m_spec).staticAttributeCount) {
    pcVar11 = (code *)0x0;
    lVar13 = 0;
    do {
      pcVar1 = *(code **)(lVar6 + 0x780);
      dVar5 = (this->m_program->m_program).m_program;
      local_208 = pcVar11;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,(int)lVar13);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_1f8,0,(char *)0x0,0x1c20678);
      local_230 = &local_220;
      plVar8 = plVar7 + 2;
      if ((long *)*plVar7 == plVar8) {
        local_220 = *plVar8;
        uStack_218 = (undefined4)plVar7[3];
        uStack_214 = *(undefined4 *)((long)plVar7 + 0x1c);
      }
      else {
        local_220 = *plVar8;
        local_230 = (long *)*plVar7;
      }
      *plVar7 = (long)plVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      uVar3 = (*pcVar1)(dVar5,local_230);
      pcVar11 = local_208;
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
      (**(code **)(lVar6 + 0x610))(uVar3);
      if ((this->m_spec).useStaticBuffer == true) {
        (**(code **)(lVar6 + 0x40))
                  (0x8892,(this->m_unbatchedStaticBuffers).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar13]);
        (**(code **)(lVar6 + 0x19f0))(uVar3,4,0x1400,1,0,0);
        (**(code **)(lVar6 + 0x40))(0x8892,0);
      }
      else {
        (**(code **)(lVar6 + 0x19f0))
                  (uVar3,4,0x1400,1,0,
                   *(undefined8 *)
                    (pcVar11 +
                    (long)(this->m_staticAttributeDatas).
                          super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start));
      }
      lVar13 = lVar13 + 1;
      pcVar11 = pcVar11 + 0x18;
    } while (lVar13 < (this->m_spec).staticAttributeCount);
  }
  if (0 < (this->m_spec).dynamicAttributeCount) {
    iVar2 = 0;
    do {
      local_208 = *(code **)(lVar6 + 0x780);
      local_20c = (this->m_program->m_program).m_program;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,iVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_1f8,0,(char *)0x0,0x1c20698);
      local_230 = &local_220;
      plVar8 = plVar7 + 2;
      if ((long *)*plVar7 == plVar8) {
        local_220 = *plVar8;
        uStack_218 = (undefined4)plVar7[3];
        uStack_214 = *(undefined4 *)((long)plVar7 + 0x1c);
      }
      else {
        local_220 = *plVar8;
        local_230 = (long *)*plVar7;
      }
      *plVar7 = (long)plVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      iVar4 = (*local_208)(local_20c,local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
      local_1fc = iVar4;
      (**(code **)(lVar6 + 0x610))(iVar4);
      if (iStack_1d0._M_current == local_1c8) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_1d8,iStack_1d0,&local_1fc);
      }
      else {
        *iStack_1d0._M_current = local_1fc;
        iStack_1d0._M_current = iStack_1d0._M_current + 1;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < (this->m_spec).dynamicAttributeCount);
  }
  if ((((this->m_spec).useDrawElements != false) && ((this->m_spec).useIndexBuffer == true)) &&
     ((this->m_spec).dynamicIndices == false)) {
    (**(code **)(lVar6 + 0x40))(0x8893,this->m_unbatchedStaticIndexBuffer);
  }
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Failed to setup initial state for rendering.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x268);
  (**(code **)(lVar6 + 0x648))();
  local_1b0 = deGetMicroseconds();
  if (0 < (this->m_spec).drawCallCount) {
    lVar13 = 0;
    do {
      if (0 < (this->m_spec).dynamicAttributeCount) {
        lVar10 = 0;
        lVar12 = 0;
        do {
          if ((this->m_spec).useDynamicBuffer == true) {
            (**(code **)(lVar6 + 0x40))
                      (0x8892,*(undefined4 *)
                               (*(long *)((long)&(((this->m_unbatchedDynamicBuffers).
                                                                                                      
                                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + lVar10
                                         ) + lVar13 * 4));
            (**(code **)(lVar6 + 0x19f0))
                      (*(undefined4 *)((long)local_1d8 + lVar12 * 4),4,0x1400,1,0,0);
            (**(code **)(lVar6 + 0x40))(0x8892,0);
          }
          else {
            (**(code **)(lVar6 + 0x19f0))
                      (*(undefined4 *)((long)local_1d8 + lVar12 * 4),4,0x1400,1,0,
                       (long)((this->m_spec).triangleCount * (int)lVar13 * 0xc) +
                       *(long *)((long)&(((this->m_dynamicAttributeDatas).
                                          super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar10));
          }
          lVar12 = lVar12 + 1;
          lVar10 = lVar10 + 0x18;
        } while (lVar12 < (this->m_spec).dynamicAttributeCount);
      }
      if ((this->m_spec).useDrawElements == false) {
        (**(code **)(lVar6 + 0x538))(4,0,(this->m_spec).triangleCount * 3);
      }
      else if ((this->m_spec).useIndexBuffer == true) {
        if ((this->m_spec).dynamicIndices == true) {
          (**(code **)(lVar6 + 0x40))
                    (0x8893,(this->m_unbatchedDynamicIndexBuffers).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar13]);
          (**(code **)(lVar6 + 0x568))(4,(this->m_spec).triangleCount * 3,0x1401);
          (**(code **)(lVar6 + 0x40))(0x8893);
        }
        else {
          (**(code **)(lVar6 + 0x568))(4,(this->m_spec).triangleCount * 3,0x1401,0);
        }
      }
      else {
        if ((this->m_spec).dynamicIndices == true) {
          iVar2 = (this->m_spec).triangleCount;
          puVar9 = (this->m_dynamicIndexData).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start + (int)lVar13 * iVar2 * 3;
        }
        else {
          iVar2 = (this->m_spec).triangleCount;
          puVar9 = (this->m_staticIndexData).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        (**(code **)(lVar6 + 0x568))(4,iVar2 * 3,0x1401,puVar9);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_spec).drawCallCount);
  }
  (**(code **)(lVar6 + 0x648))();
  local_1b8 = deGetMicroseconds();
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Unbatched rendering failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x299);
  (**(code **)(lVar6 + 0x40))(0x8893,0);
  if (0 < (this->m_spec).staticAttributeCount) {
    iVar2 = 0;
    do {
      local_208 = *(code **)(lVar6 + 0x780);
      local_20c = (this->m_program->m_program).m_program;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,iVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_1f8,0,(char *)0x0,0x1c20678);
      local_230 = &local_220;
      plVar8 = plVar7 + 2;
      if ((long *)*plVar7 == plVar8) {
        local_220 = *plVar8;
        uStack_218 = (undefined4)plVar7[3];
        uStack_214 = *(undefined4 *)((long)plVar7 + 0x1c);
      }
      else {
        local_220 = *plVar8;
        local_230 = (long *)*plVar7;
      }
      *plVar7 = (long)plVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      uVar3 = (*local_208)(local_20c,local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
      (**(code **)(lVar6 + 0x518))(uVar3);
      iVar2 = iVar2 + 1;
    } while (iVar2 < (this->m_spec).staticAttributeCount);
  }
  if (0 < (this->m_spec).dynamicAttributeCount) {
    lVar13 = 0;
    do {
      (**(code **)(lVar6 + 0x518))(*(undefined4 *)((long)local_1d8 + lVar13 * 4));
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_spec).dynamicAttributeCount);
  }
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Failed to reset state after unbatched rendering",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x2a6);
  if (local_1d8 != (void *)0x0) {
    operator_delete(local_1d8,(long)local_1c8 - (long)local_1d8);
  }
  return local_1b8 - local_1b0;
}

Assistant:

deUint64 DrawCallBatchingTest::renderUnbatched (void)
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	deUint64				beginUs	= 0;
	deUint64				endUs	= 0;
	vector<GLint>			dynamicAttributeLocations;

	gl.viewport(0, 0, 32, 32);
	gl.useProgram(m_program->getProgram());

	// Setup static buffers
	for (int attribNdx = 0; attribNdx < m_spec.staticAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_static" + de::toString(attribNdx)).c_str());

		gl.enableVertexAttribArray(location);

		if (m_spec.useStaticBuffer)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, m_unbatchedStaticBuffers[attribNdx]);
			gl.vertexAttribPointer(location, 4, GL_BYTE, GL_TRUE, 0, NULL);
			gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		}
		else
			gl.vertexAttribPointer(location, 4, GL_BYTE, GL_TRUE, 0, &(m_staticAttributeDatas[attribNdx][0]));
	}

	// Get locations of dynamic attributes
	for (int attribNdx = 0; attribNdx < m_spec.dynamicAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_dyn" + de::toString(attribNdx)).c_str());

		gl.enableVertexAttribArray(location);
		dynamicAttributeLocations.push_back(location);
	}

	if (m_spec.useDrawElements && m_spec.useIndexBuffer && !m_spec.dynamicIndices)
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_unbatchedStaticIndexBuffer);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup initial state for rendering.");

	gl.finish();

	beginUs = deGetMicroseconds();

	for (int drawNdx = 0; drawNdx < m_spec.drawCallCount; drawNdx++)
	{
		for (int attribNdx = 0; attribNdx < m_spec.dynamicAttributeCount; attribNdx++)
		{
			if (m_spec.useDynamicBuffer)
			{
				gl.bindBuffer(GL_ARRAY_BUFFER, m_unbatchedDynamicBuffers[attribNdx][drawNdx]);
				gl.vertexAttribPointer(dynamicAttributeLocations[attribNdx], 4, GL_BYTE, GL_TRUE, 0, NULL);
				gl.bindBuffer(GL_ARRAY_BUFFER, 0);
			}
			else
				gl.vertexAttribPointer(dynamicAttributeLocations[attribNdx], 4, GL_BYTE, GL_TRUE, 0, &(m_dynamicAttributeDatas[attribNdx][m_spec.triangleCount * 3 * drawNdx * 4]));
		}

		if (m_spec.useDrawElements)
		{
			if (m_spec.useIndexBuffer)
			{
				if (m_spec.dynamicIndices)
				{
					gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_unbatchedDynamicIndexBuffers[drawNdx]);
					gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3, GL_UNSIGNED_BYTE, NULL);
					gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
				}
				else
					gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3, GL_UNSIGNED_BYTE, NULL);
			}
			else
			{
				if (m_spec.dynamicIndices)
					gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3, GL_UNSIGNED_BYTE, &(m_dynamicIndexData[drawNdx * m_spec.triangleCount * 3]));
				else
					gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3, GL_UNSIGNED_BYTE, &(m_staticIndexData[0]));
			}
		}
		else
			gl.drawArrays(GL_TRIANGLES, 0, 3 * m_spec.triangleCount);
	}

	gl.finish();

	endUs = deGetMicroseconds();

	GLU_EXPECT_NO_ERROR(gl.getError(), "Unbatched rendering failed");

	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);

	for (int attribNdx = 0; attribNdx < m_spec.staticAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_static" + de::toString(attribNdx)).c_str());
		gl.disableVertexAttribArray(location);
	}

	for (int attribNdx = 0; attribNdx < m_spec.dynamicAttributeCount; attribNdx++)
		gl.disableVertexAttribArray(dynamicAttributeLocations[attribNdx]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to reset state after unbatched rendering");

	return endUs - beginUs;
}